

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O1

FieldDescriptor **
google::protobuf::compiler::objectivec::anon_unknown_7::SortFieldsByNumber(Descriptor *descriptor)

{
  FieldDescriptor **ppFVar1;
  int iVar2;
  int iVar3;
  FieldDescriptor *pFVar4;
  long lVar5;
  FieldDescriptor **ppFVar6;
  FieldDescriptor *pFVar7;
  ulong uVar8;
  FieldDescriptor **ppFVar9;
  FieldDescriptor **__i;
  ulong uVar10;
  FieldDescriptor **ppFVar11;
  
  iVar2 = *(int *)(descriptor + 0x2c);
  uVar10 = (ulong)iVar2;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)uVar10) {
    uVar8 = uVar10 * 8;
  }
  ppFVar6 = (FieldDescriptor **)operator_new__(uVar8);
  if (0 < (long)uVar10) {
    pFVar7 = *(FieldDescriptor **)(descriptor + 0x30);
    uVar8 = 0;
    do {
      ppFVar6[uVar8] = pFVar7;
      uVar8 = uVar8 + 1;
      pFVar7 = pFVar7 + 0xa8;
    } while (uVar10 != uVar8);
  }
  if (iVar2 != 0) {
    ppFVar1 = ppFVar6 + uVar10;
    lVar5 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<google::protobuf::FieldDescriptor_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByNumber>>
              (ppFVar6,ppFVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if (iVar2 < 0x11) {
      std::
      __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByNumber>>
                (ppFVar6,ppFVar1);
    }
    else {
      ppFVar11 = ppFVar6 + 0x10;
      std::
      __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByNumber>>
                (ppFVar6,ppFVar11);
      do {
        pFVar7 = ppFVar11[-1];
        pFVar4 = *ppFVar11;
        iVar3 = *(int *)(pFVar4 + 0x38);
        iVar2 = *(int *)(pFVar7 + 0x38);
        ppFVar9 = ppFVar11;
        while (iVar3 < iVar2) {
          *ppFVar9 = pFVar7;
          pFVar7 = ppFVar9[-2];
          ppFVar9 = ppFVar9 + -1;
          iVar2 = *(int *)(pFVar7 + 0x38);
        }
        *ppFVar9 = pFVar4;
        ppFVar11 = ppFVar11 + 1;
      } while (ppFVar11 != ppFVar1);
    }
  }
  return ppFVar6;
}

Assistant:

const FieldDescriptor** SortFieldsByNumber(const Descriptor* descriptor) {
  const FieldDescriptor** fields =
      new const FieldDescriptor* [descriptor->field_count()];
  for (int i = 0; i < descriptor->field_count(); i++) {
    fields[i] = descriptor->field(i);
  }
  sort(fields, fields + descriptor->field_count(), FieldOrderingByNumber());
  return fields;
}